

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

string * __thiscall
gimage::(anonymous_namespace)::readRAWHeader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *name,int *type,
          bool *msbfirst,long *width,long *height)

{
  uint *puVar1;
  long lVar2;
  istream *piVar3;
  IOException *this_00;
  char sep2;
  char sep1;
  allocator local_239;
  int *local_238;
  char order;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream in;
  uint auStack_198 [2];
  byte abStack_190 [352];
  
  local_238 = (int *)name;
  std::__cxx11::string::string((string *)&s,(char *)this,(allocator *)&in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::find((char)&s,0x26);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::replace((ulong)&s,s._M_string_length - 4,(char *)0x4);
    gutil::Properties::Properties((Properties *)&in,s._M_dataplus._M_p);
    gutil::Properties::getValue<long>((Properties *)&in,"image.width",(long *)msbfirst,(char *)0x0);
    gutil::Properties::getValue<long>((Properties *)&in,"image.height",width,(char *)0x0);
    gutil::Properties::getValue<int>((Properties *)&in,"image.pixelsize",local_238,(char *)0x0);
    gutil::Properties::getValue<bool>((Properties *)&in,"image.msbfirst",(bool *)type,"false");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&in);
  }
  else {
    std::__cxx11::string::substr((ulong)&order,(ulong)&s);
    std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)&order,_S_in);
    std::__cxx11::string::~string((string *)&order);
    sep1 = '\0';
    sep2 = '\0';
    puVar1 = (uint *)((long)auStack_198 + *(long *)(_in + -0x18));
    *puVar1 = *puVar1 & 0xffffefff;
    piVar3 = std::istream::_M_extract<long>((long *)&in);
    piVar3 = std::operator>>(piVar3,&sep1);
    piVar3 = std::istream::_M_extract<long>((long *)piVar3);
    piVar3 = std::operator>>(piVar3,&sep2);
    std::istream::operator>>((istream *)piVar3,local_238);
    if ((((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) || (sep1 != 'x')) || (sep2 != 'x')) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_1f0,(char *)this,&local_239);
      std::operator+(&local_1d0,"Wrong format of RAW header information (",&local_1f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&order,
                     &local_1d0,")");
      gutil::IOException::IOException(this_00,(string *)&order);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    *(undefined1 *)type = 0;
    if ((abStack_190[*(long *)(_in + -0x18)] & 2) == 0) {
      std::operator>>((istream *)&in,&order);
      if (order == 'm') {
        *(undefined1 *)type = 1;
      }
    }
    std::__cxx11::string::substr((ulong)&order,(ulong)&s);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&order);
    std::__cxx11::string::~string((string *)&order);
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  }
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string readRAWHeader(const char *name, int &type, bool &msbfirst, long &width,
                          long &height)
{
  std::string s=name;
  size_t pos;
  std::string ret;

  pos=s.find('&');

  if (pos != s.npos)
  {
    std::istringstream in(s.substr(pos+1));
    char sep1=0, sep2=0;

    in >> std::noskipws >> width >> sep1 >> height >> sep2 >> type;

    if (in.fail() || sep1 != 'x' || sep2 != 'x')
    {
      throw gutil::IOException("Wrong format of RAW header information ("+std::string(name)+")");
    }

    msbfirst=false;

    if (!in.eof())
    {
      char order;

      in >> order;

      if (order == 'm')
      {
        msbfirst=true;
      }
    }

    ret=s.substr(0, pos);
  }
  else
  {
    ret=s;
    s.replace(s.length()-4, 4, ".hdr");

    gutil::Properties prop(s.c_str());
    prop.getValue("image.width", width);
    prop.getValue("image.height", height);
    prop.getValue("image.pixelsize", type);
    prop.getValue("image.msbfirst", msbfirst, "false");
  }

  return ret;
}